

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCCurve.cpp
# Opt level: O0

IfcVector3 * __thiscall
Assimp::IFC::anon_unknown_9::TrimmedCurve::Eval
          (IfcVector3 *__return_storage_ptr__,TrimmedCurve *this,IfcFloat p)

{
  bool bVar1;
  element_type *peVar2;
  IfcFloat p_local;
  TrimmedCurve *this_local;
  
  bVar1 = Curve::InRange((Curve *)this,p);
  if (!bVar1) {
    __assert_fail("InRange(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCCurve.cpp"
                  ,0x17b,
                  "virtual IfcVector3 Assimp::IFC::(anonymous namespace)::TrimmedCurve::Eval(IfcFloat) const"
                 );
  }
  peVar2 = std::
           __shared_ptr_access<const_Assimp::IFC::Curve,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Assimp::IFC::Curve,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->base);
  TrimParam(this,p);
  (*peVar2->_vptr_Curve[3])(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

IfcVector3 Eval(IfcFloat p) const {
        ai_assert(InRange(p));
        return base->Eval( TrimParam(p) );
    }